

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O2

bool __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
AllocInPage(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
           Page *page,size_t bytes,ushort pdataCount,ushort xdataSize,Allocation **allocationOut)

{
  BucketId BVar1;
  char *pcVar2;
  ulong uVar3;
  code *pcVar4;
  bool bVar5;
  BVIndex BVar6;
  Allocation *obj;
  undefined4 *puVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  SecondaryAllocation local_60;
  XDataAllocation xdata;
  AutoCriticalSection autoLock;
  
  obj = (Allocation *)ArenaAllocator::NoThrowAlloc(this->auxiliaryAllocator,0x38);
  (obj->xdata).super_SecondaryAllocation.address = (BYTE *)0x0;
  uVar10 = (uint)bytes;
  if (((int)uVar10 < 1) || ((uVar10 + 0x7fffffff & uVar10) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                       ,0x243,"(Math::IsPow2((int32)bytes))","Math::IsPow2((int32)bytes)");
    if (!bVar5) goto LAB_00618025;
    *puVar7 = 0;
  }
  uVar10 = 1;
  if (0x80 < bytes) {
    uVar10 = (uint)(bytes >> 7) & 0x1ffffff;
  }
  BVar6 = GetFreeIndexForPage(this,page,bytes);
  if (BVar6 != 0xffffffff) {
    pcVar2 = page->address;
    local_60.address = (BYTE *)0x0;
    if (pdataCount != 0) {
      xdata.super_SecondaryAllocation.address = (SecondaryAllocation)this->codePageAllocators;
      CCLock::Enter((CCLock *)xdata.super_SecondaryAllocation.address);
      bVar5 = ShouldBeInFullList(this,page);
      if (bVar5) {
        DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Memory::CustomHeap::Allocation>
                  (this->auxiliaryAllocator,obj);
        BVar1 = page->currentBucket;
        if (DAT_0145948a == 1) {
          Output::Trace(CustomHeapPhase,L"Moving page from bucket %d to full list\n",
                        (ulong)(uint)BVar1);
        }
        if (page->inFullList == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                             ,0x25a,"(!page->inFullList)","!page->inFullList");
          if (!bVar5) goto LAB_00618025;
          *puVar7 = 0;
        }
        DListBase<Memory::CustomHeap::Page,_RealCount>::MoveElementTo
                  (this->buckets + BVar1,page,this->fullPages + BVar1);
        page->inFullList = true;
        bVar5 = false;
        pdataCount = 0;
      }
      else {
        bVar5 = CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                ::AllocSecondary(this->codePageAllocators,page->segment,
                                 (ULONG_PTR)(pcVar2 + (BVar6 << 7)),bytes,pdataCount,xdataSize,
                                 &local_60);
        if (bVar5) {
          bVar5 = true;
        }
        else {
          DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Memory::CustomHeap::Allocation>
                    (this->auxiliaryAllocator,obj);
          pdataCount = 1;
          bVar5 = false;
        }
      }
      bVar9 = (byte)pdataCount;
      AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&xdata);
      if (!bVar5) goto LAB_00618011;
    }
    obj->field_0x28 = obj->field_0x28 & 0xfc;
    (obj->field_0).page = page;
    obj->size = bytes;
    obj->address = pcVar2 + (BVar6 << 7);
    obj->thunkAddress = 0;
    this->allocationsSinceLastCompact = this->allocationsSinceLastCompact + bytes;
    this->freeObjectSize = this->freeObjectSize - bytes;
    uVar8 = (0xffffffffffffffffU >> (-(char)uVar10 & 0x3fU)) << ((byte)BVar6 & 0x3f);
    uVar3 = (page->freeBitVector).word;
    if ((uVar8 & ~uVar3) == 0) {
      (page->freeBitVector).word = uVar3 & ~uVar8;
      if (DAT_0145948a == 1) {
        Output::Trace(CustomHeapPhase,L"ChunkSize: %d, Index: %d, Free bit vector in page: ",
                      (ulong)uVar10,(ulong)BVar6);
      }
      if ((DAT_0145948a & 1) != 0) {
        Output::Trace(CustomHeapPhase,L"\n");
      }
      bVar5 = ShouldBeInFullList(this,page);
      if (bVar5) {
        BVar1 = page->currentBucket;
        if (DAT_0145948a == 1) {
          Output::Trace(CustomHeapPhase,L"Moving page from bucket %d to full list\n",
                        (ulong)(uint)BVar1);
        }
        if (page->inFullList == true) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                             ,0x292,"(!page->inFullList)","!page->inFullList");
          if (!bVar5) {
LAB_00618025:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar7 = 0;
        }
        DListBase<Memory::CustomHeap::Page,_RealCount>::MoveElementTo
                  (this->buckets + BVar1,page,this->fullPages + BVar1);
        page->inFullList = true;
      }
      (obj->xdata).super_SecondaryAllocation.address = local_60.address;
      *allocationOut = obj;
      bVar9 = 1;
      goto LAB_00618011;
    }
  }
  CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
  bVar9 = 0;
LAB_00618011:
  return (bool)(bVar9 & 1);
}

Assistant:

bool Heap<TAlloc, TPreReservedAlloc>::AllocInPage(Page* page, size_t bytes, ushort pdataCount, ushort xdataSize, Allocation ** allocationOut)
{
    Allocation * allocation = AnewNoThrowStruct(this->auxiliaryAllocator, Allocation);
    if (allocation == nullptr)
    {
        return true;
    }

    Assert(Math::IsPow2((int32)bytes));

    uint length = GetChunkSizeForBytes(bytes);
    BVIndex index = GetFreeIndexForPage(page, bytes);
    if (index == BVInvalidIndex)
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return false;
    }
    char* address = page->address + Page::Alignment * index;

#if PDATA_ENABLED
    XDataAllocation xdata;
    if(pdataCount > 0)
    {
        AutoCriticalSection autoLock(&this->codePageAllocators->cs);
        if (this->ShouldBeInFullList(page))
        {
            Adelete(this->auxiliaryAllocator, allocation);
            // If we run out of XData space with the segment, move the page to the full page list, and return false to try the next page.
            BucketId bucket = page->currentBucket;
            VerboseHeapTrace(_u("Moving page from bucket %d to full list\n"), bucket);

            Assert(!page->inFullList);
            this->buckets[bucket].MoveElementTo(page, &this->fullPages[bucket]);
            page->inFullList = true;
            return false;
        }

        if (!this->codePageAllocators->AllocSecondary(page->segment, (ULONG_PTR)address, bytes, pdataCount, xdataSize, &xdata))
        {
            Adelete(this->auxiliaryAllocator, allocation);
            return true;
        }
    }
#endif

#if DBG
    allocation->isAllocationUsed = false;
    allocation->isNotExecutableBecauseOOM = false;
#endif

    allocation->page = page;
    allocation->size = bytes;
    allocation->address = address;
    allocation->thunkAddress = 0;

#if DBG_DUMP
    this->allocationsSinceLastCompact += bytes;
    this->freeObjectSize -= bytes;
#endif

    //Section of the Page should already be freed.
    if (!page->freeBitVector.TestRange(index, length))
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return false;
    }

    //Section of the Page should already be freed.
    if (!page->freeBitVector.TestRange(index, length))
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return false;
    }

    page->freeBitVector.ClearRange(index, length);
    VerboseHeapTrace(_u("ChunkSize: %d, Index: %d, Free bit vector in page: "), length, index);

#if VERBOSE_HEAP
    page->freeBitVector.DumpWord();
#endif
    VerboseHeapTrace(_u("\n"));

    if (this->ShouldBeInFullList(page))
    {
        BucketId bucket = page->currentBucket;
        VerboseHeapTrace(_u("Moving page from bucket %d to full list\n"), bucket);

        Assert(!page->inFullList);
        this->buckets[bucket].MoveElementTo(page, &this->fullPages[bucket]);
        page->inFullList = true;
    }

#if PDATA_ENABLED
    allocation->xdata = xdata;
#endif

    *allocationOut = allocation;
    return true;
}